

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ArgMinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_argmin(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3fc) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3fc;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    ArgMinLayerParams::ArgMinLayerParams(this_00.argmin_);
    (this->layer_).argmin_ = (ArgMinLayerParams *)this_00;
  }
  return (ArgMinLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgMinLayerParams* NeuralNetworkLayer::mutable_argmin() {
  if (!has_argmin()) {
    clear_layer();
    set_has_argmin();
    layer_.argmin_ = new ::CoreML::Specification::ArgMinLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.argMin)
  return layer_.argmin_;
}